

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O1

bool phyr::solveQuadraticSystem(FPError a,FPError b,FPError c,FPError *t1,FPError *t2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FPError local_88;
  double local_70;
  double local_68;
  FPError local_60;
  FPError local_48;
  
  t1->v = 2.2250738585072014e-308;
  t1->lBound = 2.2250738585072014e-308;
  t1->uBound = 2.2250738585072014e-308;
  t2->v = 1.79769313486232e+308;
  t2->lBound = 1.79769313486232e+308;
  t2->uBound = 1.79769313486232e+308;
  FPError::operator*(&local_60,&b,&b);
  local_88.uBound = 4.0;
  local_88.v = 4.0;
  local_88.lBound = 4.0;
  FPError::operator*(&local_48,&local_88,&a);
  FPError::operator*(&local_88,&local_48,&c);
  local_70 = local_60.v - local_88.v;
  local_88.uBound = 2.0;
  local_88.v = 2.0;
  local_88.lBound = 2.0;
  FPError::operator*(&local_60,&local_88,&a);
  if (0.0 <= local_70) {
    if ((local_70 != 0.0) || (NAN(local_70))) {
      if (local_70 < 0.0) {
        local_68 = sqrt(local_70);
      }
      else {
        local_68 = SQRT(local_70);
      }
      local_48.lBound = -b.lBound - local_68;
      if (-INFINITY < local_48.lBound) {
        dVar1 = (double)(~-(ulong)(local_48.lBound == 0.0) & (ulong)local_48.lBound |
                        -(ulong)(local_48.lBound == 0.0) & 0x8000000000000000);
        local_48.lBound = (double)((long)dVar1 + (ulong)(dVar1 <= 0.0) * 2 + -1);
      }
      local_48.uBound = -b.uBound - local_68;
      if (local_48.uBound < INFINITY) {
        local_48.uBound = (double)(~-(ulong)(local_48.uBound == 0.0) & (ulong)local_48.uBound);
        local_48.uBound = (double)((-(ulong)(local_48.uBound < 0.0) | 1) + (long)local_48.uBound);
      }
      local_48.v = -b.v - local_68;
      FPError::operator/(&local_88,&local_48,&local_60);
      t1->uBound = local_88.uBound;
      t1->v = local_88.v;
      t1->lBound = local_88.lBound;
      local_48.lBound = local_68 - b.lBound;
      if (-INFINITY < local_48.lBound) {
        dVar1 = (double)(~-(ulong)(local_48.lBound == 0.0) & (ulong)local_48.lBound |
                        -(ulong)(local_48.lBound == 0.0) & 0x8000000000000000);
        local_48.lBound = (double)((long)dVar1 + (ulong)(dVar1 <= 0.0) * 2 + -1);
      }
      local_48.uBound = local_68 - b.uBound;
      if (local_48.uBound < INFINITY) {
        local_48.uBound = (double)(~-(ulong)(local_48.uBound == 0.0) & (ulong)local_48.uBound);
        local_48.uBound = (double)((-(ulong)(local_48.uBound < 0.0) | 1) + (long)local_48.uBound);
      }
      local_48.v = local_68 - b.v;
      FPError::operator/(&local_88,&local_48,&local_60);
      t2->uBound = local_88.uBound;
      t2->v = local_88.v;
      t2->lBound = local_88.lBound;
    }
    else {
      local_48.uBound = -b.uBound;
      local_48.v = -b.v;
      local_48.lBound = -b.lBound;
      FPError::operator/(&local_88,&local_48,&local_60);
      t1->uBound = local_88.uBound;
      t1->v = local_88.v;
      t1->lBound = local_88.lBound;
    }
    if (t2->v <= t1->v && t1->v != t2->v) {
      dVar1 = t1->uBound;
      dVar2 = t1->v;
      dVar3 = t1->lBound;
      t1->uBound = t2->uBound;
      dVar4 = t2->lBound;
      t1->v = t2->v;
      t1->lBound = dVar4;
      t2->uBound = dVar1;
      t2->v = dVar2;
      t2->lBound = dVar3;
    }
  }
  return 0.0 <= local_70;
}

Assistant:

inline bool solveQuadraticSystem(FPError a, FPError b, FPError c, FPError* t1, FPError* t2) {
    // Default improbable solutions
    *t1 = MinReal; *t2 = MaxReal;

    FPError det = b*b - 4*a*c, den = 2 * a;
    // No real solutions exist
    if (Real(det) < 0) return false;
    // Single solution
    else if (Real(det) == 0) { *t1 = -b / den; }
    // Two solutions
    else {
        det = std::sqrt(Real(det));
        *t1 = (-b - det) / den; *t2 = (-b + det) / den;
    }

    if (Real(*t1) > Real(*t2)) std::swap(*t1, *t2);
    return true;
}